

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

tuple<int,_int,_int> __thiscall
anon_unknown.dwarf_ccf27::preprocessor<baryonyx::raw_problem>::reduce
          (preprocessor<baryonyx::raw_problem> *this,constraint *constraint)

{
  int iVar1;
  bool bVar2;
  const_reference pvVar3;
  pointer ppVar4;
  long in_RDX;
  tuple<int,_int,_int> tVar5;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> local_48;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> local_40;
  iterator it;
  int e;
  int i;
  int var_id;
  int factor;
  int remaining_index;
  int constraint_result;
  constraint *constraint_local;
  preprocessor<baryonyx::raw_problem> *this_local;
  
  factor = *(int *)(in_RDX + 0x28);
  var_id = -1;
  it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur._4_4_ = 0;
  _remaining_index = in_RDX;
  constraint_local = constraint;
  this_local = this;
  it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur._0_4_ =
       baryonyx::
       length<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                 ((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *
                  )(in_RDX + 0x10));
  do {
    if (it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur._4_4_ ==
        (int)it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur) {
      if (var_id < 0) {
        i = -1;
        e = -1;
      }
      else {
        pvVar3 = std::
                 vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                 operator[]((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                             *)(_remaining_index + 0x10),(long)var_id);
        i = pvVar3->factor;
        pvVar3 = std::
                 vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                 operator[]((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                             *)(_remaining_index + 0x10),(long)var_id);
        e = pvVar3->variable_index;
      }
      tVar5 = std::make_tuple<int&,int&,int&>((int *)this,&i,&e);
      tVar5.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
           (_Tuple_impl<1UL,_int,_int>)this;
      return (tuple<int,_int,_int>)tVar5.super__Tuple_impl<0UL,_int,_int,_int>;
    }
    pvVar3 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             operator[]((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         *)(_remaining_index + 0x10),
                        (long)it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur
                              ._4_4_);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
         ::find((unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                 *)&constraint->elements,&pvVar3->variable_index);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
         ::end((unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                *)&constraint->elements);
    bVar2 = std::__detail::operator==(&local_40,&local_48);
    if (bVar2) {
      if (var_id != -1) {
        baryonyx::details::fail_fast
                  ("Assertion","remaining_index == -1",
                   "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                   ,"171");
      }
      var_id = it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur._4_4_;
    }
    else {
      pvVar3 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ::operator[]((vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                             *)(_remaining_index + 0x10),
                            (long)it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>.
                                  _M_cur._4_4_);
      iVar1 = pvVar3->factor;
      ppVar4 = std::__detail::_Node_iterator<std::pair<const_int,_bool>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_int,_bool>,_false,_false> *)&local_40);
      factor = factor - iVar1 * (uint)(ppVar4->second & 1);
    }
    it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur._4_4_ =
         it.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur._4_4_ + 1;
  } while( true );
}

Assistant:

auto reduce(const bx::constraint& constraint) -> std::tuple<int, int, int>
    {
        int constraint_result{ constraint.value };
        int remaining_index{ -1 };
        int factor;
        int var_id;

        for (int i = 0, e = bx::length(constraint.elements); i != e; ++i) {

            // Searches if the variable is already affected and then use the
            // value to update the value of the constraint.

            auto it = vars.find(constraint.elements[i].variable_index);
            if (it == vars.end()) {
                bx_assert(remaining_index == -1);
                remaining_index = i;
            } else {
                constraint_result +=
                  -1 * (constraint.elements[i].factor * it->second);
            }
        }

        if (remaining_index >= 0) {
            factor = constraint.elements[remaining_index].factor;
            var_id = constraint.elements[remaining_index].variable_index;
        } else {
            factor = -1;
            var_id = -1;
        }

        return std::make_tuple(factor, var_id, constraint_result);
    }